

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatMemory.h
# Opt level: O1

uint xSAT_MemAppend(xSAT_Mem_t *p,int nSize)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  
  if (nSize < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                  ,0xa0,"unsigned int xSAT_MemAppend(xSAT_Mem_t *, int)");
  }
  uVar2 = p->nSize + nSize;
  uVar1 = p->nCap;
  uVar4 = uVar1;
  if (uVar1 < uVar2) {
    while (uVar4 < uVar2) {
      uVar4 = uVar4 + ((uVar4 >> 3) + (uVar4 >> 1) & 0xfffffffe) + 2;
      p->nCap = uVar4;
      if (uVar4 < uVar1) {
        __assert_fail("p->nCap >= nPrevCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                      ,0x54,"void xSAT_MemGrow(xSAT_Mem_t *, unsigned int)");
      }
    }
    if (uVar4 == 0) {
      __assert_fail("p->nCap > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                    ,0x56,"void xSAT_MemGrow(xSAT_Mem_t *, unsigned int)");
    }
    if (p->pData == (uint *)0x0) {
      puVar3 = (uint *)malloc((ulong)uVar4 << 2);
    }
    else {
      puVar3 = (uint *)realloc(p->pData,(ulong)uVar4 << 2);
    }
    p->pData = puVar3;
  }
  uVar1 = p->nSize;
  p->nSize = nSize + uVar1;
  if (nSize + uVar1 <= uVar1) {
    __assert_fail("p->nSize > nPrevSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                  ,0xa4,"unsigned int xSAT_MemAppend(xSAT_Mem_t *, int)");
  }
  return uVar1;
}

Assistant:

static inline unsigned xSAT_MemAppend( xSAT_Mem_t * p, int nSize )
{
    unsigned nPrevSize;
    assert(nSize > 0);
    xSAT_MemGrow( p, p->nSize + nSize );
    nPrevSize = p->nSize;
    p->nSize += nSize;
    assert(p->nSize > nPrevSize);
    return nPrevSize;
}